

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

int32_t icu_63::PluralFormat::findSubMessage
                  (MessagePattern *pattern,int32_t partIndex,PluralSelector *selector,void *context,
                  double number,UErrorCode *ec)

{
  UBool UVar1;
  int8_t iVar2;
  int32_t iVar3;
  UMessagePatternPartType UVar4;
  int i;
  int32_t iVar5;
  Part *pPVar6;
  double dVar7;
  UnicodeString local_140;
  undefined4 local_fc;
  UMessagePatternPartType local_f8;
  int local_f4;
  UMessagePatternPartType type;
  int32_t msgStart;
  UBool haveKeywordMatch;
  ConstChar16Ptr local_e0;
  undefined1 local_d8 [8];
  UnicodeString other;
  UnicodeString keyword;
  Part *part;
  double offset;
  int32_t count;
  UErrorCode *ec_local;
  double number_local;
  void *context_local;
  PluralSelector *selector_local;
  int32_t partIndex_local;
  MessagePattern *pattern_local;
  
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    iVar3 = MessagePattern::countParts(pattern);
    pPVar6 = MessagePattern::getPart(pattern,partIndex);
    UVar4 = MessagePattern::Part::getType(pPVar6);
    UVar1 = MessagePattern::Part::hasNumericValue(UVar4);
    if (UVar1 == '\0') {
      part = (Part *)0x0;
      selector_local._4_4_ = partIndex;
    }
    else {
      part = (Part *)MessagePattern::getNumericValue(pattern,pPVar6);
      selector_local._4_4_ = partIndex + 1;
    }
    UnicodeString::UnicodeString((UnicodeString *)((long)&other.fUnion + 0x30));
    ConstChar16Ptr::ConstChar16Ptr(&local_e0,(char16_t *)OTHER_STRING);
    UnicodeString::UnicodeString((UnicodeString *)local_d8,'\0',&local_e0,5);
    ConstChar16Ptr::~ConstChar16Ptr(&local_e0);
    type._3_1_ = UMSGPAT_PART_TYPE_MSG_START >> 0x18;
    local_f4 = 0;
    do {
      i = selector_local._4_4_ + 1;
      pPVar6 = MessagePattern::getPart(pattern,selector_local._4_4_);
      local_f8 = MessagePattern::Part::getType(pPVar6);
      if (local_f8 == UMSGPAT_PART_TYPE_ARG_LIMIT) break;
      UVar4 = MessagePattern::getPartType(pattern,i);
      UVar1 = MessagePattern::Part::hasNumericValue(UVar4);
      if (UVar1 == '\0') {
        selector_local._4_4_ = i;
        if (type._3_1_ == UMSGPAT_PART_TYPE_MSG_START >> 0x18) {
          UVar1 = MessagePattern::partSubstringMatches(pattern,pPVar6,(UnicodeString *)local_d8);
          if (UVar1 == '\0') {
            UVar1 = UnicodeString::isEmpty((UnicodeString *)((long)&other.fUnion + 0x30));
            if (UVar1 != '\0') {
              (*selector->_vptr_PluralSelector[2])
                        (number - (double)part,&local_140,selector,context,ec);
              UnicodeString::operator=((UnicodeString *)((long)&other.fUnion + 0x30),&local_140);
              UnicodeString::~UnicodeString(&local_140);
              if ((local_f4 != 0) &&
                 (iVar2 = UnicodeString::compare
                                    ((UnicodeString *)((long)&other.fUnion + 0x30),
                                     (UnicodeString *)local_d8), iVar2 == '\0')) {
                type._3_1_ = 1;
              }
            }
            if ((type._3_1_ == UMSGPAT_PART_TYPE_MSG_START >> 0x18) &&
               (UVar1 = MessagePattern::partSubstringMatches
                                  (pattern,pPVar6,(UnicodeString *)((long)&other.fUnion + 0x30)),
               UVar1 != '\0')) {
              type._3_1_ = 1;
              local_f4 = i;
            }
          }
          else if ((local_f4 == 0) &&
                  (local_f4 = i,
                  iVar2 = UnicodeString::compare
                                    ((UnicodeString *)((long)&other.fUnion + 0x30),
                                     (UnicodeString *)local_d8), iVar2 == '\0')) {
            type._3_1_ = 1;
          }
        }
      }
      else {
        selector_local._4_4_ = selector_local._4_4_ + 2;
        pPVar6 = MessagePattern::getPart(pattern,i);
        dVar7 = MessagePattern::getNumericValue(pattern,pPVar6);
        if ((number == dVar7) &&
           (pattern_local._4_4_ = selector_local._4_4_, !NAN(number) && !NAN(dVar7)))
        goto LAB_0030b907;
      }
      iVar5 = MessagePattern::getLimitPartIndex(pattern,selector_local._4_4_);
      selector_local._4_4_ = iVar5 + 1;
    } while (selector_local._4_4_ < iVar3);
    pattern_local._4_4_ = local_f4;
LAB_0030b907:
    local_fc = 1;
    UnicodeString::~UnicodeString((UnicodeString *)local_d8);
    UnicodeString::~UnicodeString((UnicodeString *)((long)&other.fUnion + 0x30));
  }
  else {
    pattern_local._4_4_ = 0;
  }
  return pattern_local._4_4_;
}

Assistant:

int32_t PluralFormat::findSubMessage(const MessagePattern& pattern, int32_t partIndex,
                                     const PluralSelector& selector, void *context,
                                     double number, UErrorCode& ec) {
    if (U_FAILURE(ec)) {
        return 0;
    }
    int32_t count=pattern.countParts();
    double offset;
    const MessagePattern::Part* part=&pattern.getPart(partIndex);
    if (MessagePattern::Part::hasNumericValue(part->getType())) {
        offset=pattern.getNumericValue(*part);
        ++partIndex;
    } else {
        offset=0;
    }
    // The keyword is empty until we need to match against a non-explicit, not-"other" value.
    // Then we get the keyword from the selector.
    // (In other words, we never call the selector if we match against an explicit value,
    // or if the only non-explicit keyword is "other".)
    UnicodeString keyword;
    UnicodeString other(FALSE, OTHER_STRING, 5);
    // When we find a match, we set msgStart>0 and also set this boolean to true
    // to avoid matching the keyword again (duplicates are allowed)
    // while we continue to look for an explicit-value match.
    UBool haveKeywordMatch=FALSE;
    // msgStart is 0 until we find any appropriate sub-message.
    // We remember the first "other" sub-message if we have not seen any
    // appropriate sub-message before.
    // We remember the first matching-keyword sub-message if we have not seen
    // one of those before.
    // (The parser allows [does not check for] duplicate keywords.
    // We just have to make sure to take the first one.)
    // We avoid matching the keyword twice by also setting haveKeywordMatch=true
    // at the first keyword match.
    // We keep going until we find an explicit-value match or reach the end of the plural style.
    int32_t msgStart=0;
    // Iterate over (ARG_SELECTOR [ARG_INT|ARG_DOUBLE] message) tuples
    // until ARG_LIMIT or end of plural-only pattern.
    do {
        part=&pattern.getPart(partIndex++);
        const UMessagePatternPartType type = part->getType();
        if(type==UMSGPAT_PART_TYPE_ARG_LIMIT) {
            break;
        }
        U_ASSERT (type==UMSGPAT_PART_TYPE_ARG_SELECTOR);
        // part is an ARG_SELECTOR followed by an optional explicit value, and then a message
        if(MessagePattern::Part::hasNumericValue(pattern.getPartType(partIndex))) {
            // explicit value like "=2"
            part=&pattern.getPart(partIndex++);
            if(number==pattern.getNumericValue(*part)) {
                // matches explicit value
                return partIndex;
            }
        } else if(!haveKeywordMatch) {
            // plural keyword like "few" or "other"
            // Compare "other" first and call the selector if this is not "other".
            if(pattern.partSubstringMatches(*part, other)) {
                if(msgStart==0) {
                    msgStart=partIndex;
                    if(0 == keyword.compare(other)) {
                        // This is the first "other" sub-message,
                        // and the selected keyword is also "other".
                        // Do not match "other" again.
                        haveKeywordMatch=TRUE;
                    }
                }
            } else {
                if(keyword.isEmpty()) {
                    keyword=selector.select(context, number-offset, ec);
                    if(msgStart!=0 && (0 == keyword.compare(other))) {
                        // We have already seen an "other" sub-message.
                        // Do not match "other" again.
                        haveKeywordMatch=TRUE;
                        // Skip keyword matching but do getLimitPartIndex().
                    }
                }
                if(!haveKeywordMatch && pattern.partSubstringMatches(*part, keyword)) {
                    // keyword matches
                    msgStart=partIndex;
                    // Do not match this keyword again.
                    haveKeywordMatch=TRUE;
                }
            }
        }
        partIndex=pattern.getLimitPartIndex(partIndex);
    } while(++partIndex<count);
    return msgStart;
}